

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ROMCatalogue.cpp
# Opt level: O1

vector<ROM::Description,_std::allocator<ROM::Description>_> * ROM::all_descriptions(void)

{
  Name name;
  vector<ROM::Description,_std::allocator<ROM::Description>_> *in_RDI;
  Description DStack_c8;
  
  (in_RDI->super__Vector_base<ROM::Description,_std::allocator<ROM::Description>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (in_RDI->super__Vector_base<ROM::Description,_std::allocator<ROM::Description>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (in_RDI->super__Vector_base<ROM::Description,_std::allocator<ROM::Description>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  name = AcornBASICII;
  do {
    Description::Description(&DStack_c8,name);
    std::vector<ROM::Description,_std::allocator<ROM::Description>_>::emplace_back<ROM::Description>
              (in_RDI,&DStack_c8);
    std::
    _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
    ::~_Rb_tree(&DStack_c8.crc32s._M_t);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&DStack_c8.file_names);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)DStack_c8.descriptive_name._M_dataplus._M_p != &DStack_c8.descriptive_name.field_2) {
      operator_delete(DStack_c8.descriptive_name._M_dataplus._M_p,
                      DStack_c8.descriptive_name.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)DStack_c8.machine_name._M_dataplus._M_p != &DStack_c8.machine_name.field_2) {
      operator_delete(DStack_c8.machine_name._M_dataplus._M_p,
                      DStack_c8.machine_name.field_2._M_allocated_capacity + 1);
    }
    name = name + AcornBASICII;
  } while (name != (Vic20SwedishCharacters|AmigaKickstart10));
  return in_RDI;
}

Assistant:

std::vector<Description> ROM::all_descriptions() {
	std::vector<Description> result;
	for(int name = 1; name <= MaxName; name++) {
		result.push_back(Description(ROM::Name(name)));
	}
	return result;
}